

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::SetupResults(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  SimpleParallelAnalyzer *this_local;
  
  this_00 = (SimpleParallelAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<SimpleParallelAnalyzerSettings>::get(&this->mSettings);
  SimpleParallelAnalyzerResults::SimpleParallelAnalyzerResults(this_00,this,settings);
  std::auto_ptr<SimpleParallelAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<SimpleParallelAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<SimpleParallelAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<SimpleParallelAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void SimpleParallelAnalyzer::SetupResults()
{
	mResults.reset( new SimpleParallelAnalyzerResults( this, mSettings.get() ) );
	SetAnalyzerResults( mResults.get() );

	//this is the channel where the BubbleText (the analyzer output values) will show up in the
	//waveform window
	mResults->AddChannelBubblesWillAppearOn( mSettings->mClockChannel );
}